

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image * rf_image_flip_vertical(rf_image image,rf_allocator allocator)

{
  rf_image image_00;
  int iVar1;
  void *dst;
  int iVar2;
  code *in_RDX;
  rf_image *in_RDI;
  undefined8 in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  rf_pixel_format in_stack_00000018;
  char cStack000000000000001c;
  undefined1 local_a0 [8];
  code *local_98;
  void *local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 local_60;
  long lStack_58;
  undefined4 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if (cStack000000000000001c == '\0') {
    in_RDI->data = (void *)0x0;
    in_RDI->width = 0;
    in_RDI->height = 0;
    in_RDI->format = 0;
    in_RDI->valid = false;
    *(undefined3 *)&in_RDI->field_0x15 = 0;
  }
  else {
    local_98 = in_RDX;
    iVar1 = rf_bits_per_pixel(in_stack_00000018);
    iVar1 = iVar1 * in_stack_00000014 * in_stack_00000010;
    iVar2 = iVar1 + 7;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_40 = "rf_image_flip_vertical";
    local_38 = 0x3fdf;
    local_60 = 0;
    local_50 = 0;
    lStack_58 = (long)(iVar2 >> 3);
    dst = (void *)(*in_RDX)(local_a0,1);
    image_00._20_4_ = _cStack000000000000001c;
    image_00.format = in_stack_00000018;
    image_00.width = in_stack_00000010;
    image_00.data = (void *)in_stack_00000008;
    image_00.height = in_stack_00000014;
    rf_image_flip_vertical_to_buffer(in_RDI,image_00,dst,(long)(iVar2 >> 3));
    if (in_RDI->valid == false) {
      local_78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_70 = "rf_image_flip_vertical";
      local_68 = 0x3fe2;
      uStack_88 = 0;
      local_80 = 0;
      local_90 = dst;
      (*local_98)(local_a0,3);
    }
  }
  return in_RDI;
}

Assistant:

RF_API rf_image rf_image_flip_vertical(rf_image image, rf_allocator allocator)
{
    if (!image.valid) return (rf_image) {0};

    int size = rf_image_size(image);
    void* dst = RF_ALLOC(allocator, size);

    rf_image result = rf_image_flip_vertical_to_buffer(image, dst, size);
    if (!result.valid) RF_FREE(allocator, dst);

    return result;
}